

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsSat.c
# Opt level: O2

int Abc_NtkMfsSolveSat(Mfs_Man_t *p,Abc_Obj_t *pNode)

{
  uint *Sign;
  Vec_Int_t *pVVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Aig_Man_t *pAVar5;
  void *pvVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  
  p->vProjVarsSat->nSize = 0;
  pAVar5 = p->pAigWin;
  for (iVar9 = pAVar5->nObjs[3] - (pNode->vFanins).nSize; iVar9 < pAVar5->vCos->nSize;
      iVar9 = iVar9 + 1) {
    pvVar6 = Vec_PtrEntry(pAVar5->vCos,iVar9);
    iVar8 = p->pCnf->pVarNums[*(int *)((long)pvVar6 + 0x24)];
    if (iVar8 < 0) {
      __assert_fail("p->pCnf->pVarNums[pObjPo->Id] >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/mfs/mfsSat.c"
                    ,0x67,"int Abc_NtkMfsSolveSat(Mfs_Man_t *, Abc_Obj_t *)");
    }
    pVVar1 = p->vProjVarsSat;
    iVar2 = pVVar1->nSize;
    if (iVar2 == pVVar1->nCap) {
      uVar3 = iVar2 * 2;
      if (iVar2 < 0x10) {
        uVar3 = 0x10;
      }
      if (iVar2 < (int)uVar3) {
        if (pVVar1->pArray == (int *)0x0) {
          piVar7 = (int *)malloc((ulong)uVar3 << 2);
        }
        else {
          piVar7 = (int *)realloc(pVVar1->pArray,(ulong)uVar3 << 2);
        }
        pVVar1->pArray = piVar7;
        if (piVar7 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar1->nCap = uVar3;
        iVar2 = pVVar1->nSize;
      }
    }
    pVVar1->nSize = iVar2 + 1;
    pVVar1->pArray[iVar2] = iVar8;
    pAVar5 = p->pAigWin;
  }
  iVar9 = p->vProjVarsSat->nSize;
  p->nFanins = iVar9;
  iVar8 = 1 << ((char)iVar9 - 5U & 0x1f);
  if (iVar9 < 6) {
    iVar8 = 1;
  }
  p->nWords = iVar8;
  Sign = p->uCare;
  memset(Sign,0,(long)iVar8 << 2);
  p->nCares = 0;
  p->nTotConfLim = p->pPars->nBTLimit;
  do {
    iVar9 = Abc_NtkMfsSolveSat_iter(p);
  } while (iVar9 == 1);
  if (iVar9 == -1) {
    return 0;
  }
  p->nMintsCare = p->nMintsCare + p->nCares;
  iVar9 = p->nFanins;
  uVar3 = 1 << ((byte)iVar9 & 0x1f);
  p->nMintsTotal = p->nMintsTotal + uVar3;
  if (p->pPars->fVeryVerbose != 0) {
    printf("Node %4d : Care = %2d. Total = %2d.  ",(ulong)(uint)pNode->Id,(ulong)(uint)p->nCares,
           (ulong)uVar3);
    Extra_PrintBinary(_stdout,Sign,1 << ((byte)p->nFanins & 0x1f));
    putchar(10);
    iVar9 = p->nFanins;
  }
  if (4 < iVar9) {
    return 1;
  }
  switch(iVar9) {
  case 1:
    __assert_fail("p->nFanins != 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/mfs/mfsSat.c"
                  ,0x8c,"int Abc_NtkMfsSolveSat(Mfs_Man_t *, Abc_Obj_t *)");
  case 2:
    uVar3 = *Sign;
    uVar4 = uVar3 << 0x1c | uVar3 << 0x18 | uVar3 << 0x14 |
            uVar3 << 0x10 | uVar3 << 0xc | uVar3 << 8 | uVar3 << 4;
    break;
  case 3:
    uVar3 = *Sign;
    uVar4 = uVar3 << 0x18 | uVar3 | uVar3 << 0x10 | uVar3 << 8;
    goto LAB_003cc957;
  case 4:
    uVar3 = *Sign;
    uVar4 = uVar3 << 0x10;
    break;
  default:
    goto switchD_003cc8ff_default;
  }
  uVar4 = uVar4 | uVar3;
LAB_003cc957:
  *Sign = uVar4;
switchD_003cc8ff_default:
  return 1;
}

Assistant:

int Abc_NtkMfsSolveSat( Mfs_Man_t * p, Abc_Obj_t * pNode )
{
    Aig_Obj_t * pObjPo;
    int RetValue, i;
    // collect projection variables
    Vec_IntClear( p->vProjVarsSat );
    Vec_PtrForEachEntryStart( Aig_Obj_t *, p->pAigWin->vCos, pObjPo, i, Aig_ManCoNum(p->pAigWin) - Abc_ObjFaninNum(pNode) )
    {
        assert( p->pCnf->pVarNums[pObjPo->Id] >= 0 );
        Vec_IntPush( p->vProjVarsSat, p->pCnf->pVarNums[pObjPo->Id] );
    }

    // prepare the truth table of care set
    p->nFanins = Vec_IntSize( p->vProjVarsSat );
    p->nWords = Abc_TruthWordNum( p->nFanins );
    memset( p->uCare, 0, sizeof(unsigned) * p->nWords );

    // iterate through the SAT assignments
    p->nCares = 0;
    p->nTotConfLim = p->pPars->nBTLimit;
    while ( (RetValue = Abc_NtkMfsSolveSat_iter(p)) == 1 );
    if ( RetValue == -1 )
        return 0;

    // write statistics
    p->nMintsCare  += p->nCares;
    p->nMintsTotal += (1<<p->nFanins);

    if ( p->pPars->fVeryVerbose )
    {
        printf( "Node %4d : Care = %2d. Total = %2d.  ", pNode->Id, p->nCares, (1<<p->nFanins) );
        Extra_PrintBinary( stdout, p->uCare, (1<<p->nFanins) );
        printf( "\n" );
    }

    // map the care 
    if ( p->nFanins > 4 )
        return 1;
    if ( p->nFanins == 4 )
        p->uCare[0] = p->uCare[0] | (p->uCare[0] << 16);
    if ( p->nFanins == 3 )
        p->uCare[0] = p->uCare[0] | (p->uCare[0] << 8) | (p->uCare[0] << 16) | (p->uCare[0] << 24);
    if ( p->nFanins == 2 )
        p->uCare[0] = p->uCare[0] | (p->uCare[0] <<  4) | (p->uCare[0] <<  8) | (p->uCare[0] << 12) |
              (p->uCare[0] << 16) | (p->uCare[0] << 20) | (p->uCare[0] << 24) | (p->uCare[0] << 28);
    assert( p->nFanins != 1 );
    return 1;
}